

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall LLVMBC::StoreInst::StoreInst(StoreInst *this,Value *ptr,Value *value)

{
  initializer_list<LLVMBC::Value_*> __l;
  Type *pTVar1;
  LLVMContext *context;
  allocator_type local_59;
  Value *local_58;
  Value *local_50;
  iterator local_48;
  undefined8 local_40;
  vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> local_38;
  Value *local_20;
  Value *value_local;
  Value *ptr_local;
  StoreInst *this_local;
  
  local_20 = value;
  value_local = ptr;
  ptr_local = (Value *)this;
  pTVar1 = Value::getType(ptr);
  context = Type::getContext(pTVar1);
  pTVar1 = Type::getVoidTy(context);
  Instruction::Instruction(&this->super_Instruction,pTVar1,Store);
  local_58 = local_20;
  local_50 = value_local;
  local_48 = &local_58;
  local_40 = 2;
  __l._M_len = 2;
  __l._M_array = local_48;
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::vector
            (&local_38,__l,&local_59);
  Instruction::set_operands(&this->super_Instruction,&local_38);
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::~vector(&local_38)
  ;
  return;
}

Assistant:

StoreInst::StoreInst(Value *ptr, Value *value)
    : Instruction(Type::getVoidTy(ptr->getType()->getContext()), ValueKind::Store)
{
	set_operands({ value, ptr });
}